

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::structArrayCheck(TParseContext *this,TSourceLoc *param_1,TType *type)

{
  TType *pTVar1;
  long *plVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  TArraySizes *arraySizes;
  long lVar6;
  long lVar7;
  
  iVar4 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar4 != '\0') {
    pTVar1 = (type->field_13).referentType;
    lVar5 = *(long *)&pTVar1->field_0x8;
    if (0 < (int)((ulong)((long)(pTVar1->qualifier).semanticName - lVar5) >> 5)) {
      lVar7 = 8;
      lVar6 = 0;
      do {
        plVar2 = *(long **)(lVar5 + -8 + lVar7);
        cVar3 = (**(code **)(*plVar2 + 0xe8))(plVar2);
        if (cVar3 != '\0') {
          lVar5 = *(long *)&pTVar1->field_0x8;
          arraySizes = (TArraySizes *)(**(code **)(*plVar2 + 0x98))(plVar2);
          arraySizeRequiredCheck(this,(TSourceLoc *)(lVar5 + lVar7),arraySizes);
        }
        lVar6 = lVar6 + 1;
        lVar5 = *(long *)&pTVar1->field_0x8;
        lVar7 = lVar7 + 0x20;
      } while (lVar6 < (int)((ulong)((long)(pTVar1->qualifier).semanticName - lVar5) >> 5));
    }
    return;
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

void TParseContext::structArrayCheck(const TSourceLoc& /*loc*/, const TType& type)
{
    const TTypeList& structure = *type.getStruct();
    for (int m = 0; m < (int)structure.size(); ++m) {
        const TType& member = *structure[m].type;
        if (member.isArray())
            arraySizeRequiredCheck(structure[m].loc, *member.getArraySizes());
    }
}